

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Definition.cpp
# Opt level: O0

bool __thiscall slang::ast::Definition::ParameterDecl::hasDefault(ParameterDecl *this)

{
  bool local_22;
  bool local_21;
  ParameterDecl *this_local;
  
  if ((this->hasSyntax & 1U) == 0) {
    if ((this->isTypeParam & 1U) == 0) {
      this_local._7_1_ = (this->field_1).valueDecl != (DeclaratorSyntax *)0x0;
    }
    else {
      this_local._7_1_ = (this->field_0).valueSyntax != (ParameterDeclarationSyntax *)0x0;
    }
  }
  else if ((this->isTypeParam & 1U) == 0) {
    local_22 = false;
    if ((this->field_1).valueDecl != (DeclaratorSyntax *)0x0) {
      local_22 = ((this->field_1).valueDecl)->initializer != (EqualsValueClauseSyntax *)0x0;
    }
    this_local._7_1_ = local_22;
  }
  else {
    local_21 = false;
    if ((this->field_1).valueDecl != (DeclaratorSyntax *)0x0) {
      local_21 = (((this->field_1).valueDecl)->dimensions).super_SyntaxListBase._vptr_SyntaxListBase
                 != (_func_int **)0x0;
    }
    this_local._7_1_ = local_21;
  }
  return this_local._7_1_;
}

Assistant:

bool Definition::ParameterDecl::hasDefault() const {
    if (hasSyntax) {
        if (isTypeParam)
            return typeDecl && typeDecl->assignment != nullptr;
        else
            return valueDecl && valueDecl->initializer != nullptr;
    }
    else {
        if (isTypeParam)
            return givenType != nullptr;
        else
            return givenInitializer != nullptr;
    }
}